

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

const_iterator __thiscall
ghc::filesystem::path::iterator::increment(iterator *this,const_iterator *pos)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last_00;
  bool bVar1;
  reference pcVar2;
  undefined8 *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  bool fromStart;
  const_iterator i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff84;
  undefined1 in_stack_ffffffffffffff85;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar3;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff98;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  char *local_30;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  byte local_19;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8._M_current = (char *)*in_RSI;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(in_stack_ffffffffffffff85,
                                                   CONCAT14(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80)))),
                     in_stack_ffffffffffffff78);
  uVar4 = true;
  if (!bVar1) {
    uVar4 = __gnu_cxx::operator==
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff87,
                                   CONCAT16(in_stack_ffffffffffffff86,
                                            CONCAT15(in_stack_ffffffffffffff85,
                                                     CONCAT14(in_stack_ffffffffffffff84,
                                                              in_stack_ffffffffffffff80)))),
                       in_stack_ffffffffffffff78);
  }
  local_19 = uVar4;
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,
                                          CONCAT15(in_stack_ffffffffffffff85,
                                                   CONCAT14(in_stack_ffffffffffffff84,
                                                            in_stack_ffffffffffffff80)))),
                     in_stack_ffffffffffffff78);
  if (bVar1) {
    if ((((local_19 & 1) == 0) ||
        (bVar1 = __gnu_cxx::operator==
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff87,
                                        CONCAT16(in_stack_ffffffffffffff86,
                                                 CONCAT15(in_stack_ffffffffffffff85,
                                                          CONCAT14(in_stack_ffffffffffffff84,
                                                                   in_stack_ffffffffffffff80)))),
                            in_stack_ffffffffffffff78), !bVar1)) ||
       (bVar1 = __gnu_cxx::operator>
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,
                                                CONCAT15(in_stack_ffffffffffffff85,
                                                         CONCAT14(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80)))),
                           in_stack_ffffffffffffff78), !bVar1)) {
      local_28 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator++(in_RDI,CONCAT13(in_stack_ffffffffffffff87,
                                              CONCAT12(in_stack_ffffffffffffff86,
                                                       CONCAT11(in_stack_ffffffffffffff85,
                                                                in_stack_ffffffffffffff84))));
      pcVar2 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_28);
      if (*pcVar2 == '/') {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,
                                                CONCAT15(in_stack_ffffffffffffff85,
                                                         CONCAT14(in_stack_ffffffffffffff84,
                                                                  in_stack_ffffffffffffff80)))),
                           in_stack_ffffffffffffff78);
        if ((bVar1) &&
           (pcVar2 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&local_8), *pcVar2 == '/')) {
          bVar3 = 0;
          if ((local_19 & 1) != 0) {
            local_30 = (char *)__gnu_cxx::
                               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ::operator+(in_RDI,(ulong)CONCAT16(in_stack_ffffffffffffff86,
                                                                  CONCAT15(in_stack_ffffffffffffff85
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80))));
            bVar1 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                          CONCAT15(in_stack_ffffffffffffff85,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                               in_stack_ffffffffffffff78);
            in_stack_ffffffffffffff86 = false;
            if (bVar1) {
              local_38 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator+(in_RDI,CONCAT17(bVar3,(uint7)CONCAT15(in_stack_ffffffffffffff85
                                                                           ,CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80))));
              pcVar2 = __gnu_cxx::
                       __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&local_38);
              in_stack_ffffffffffffff86 = *pcVar2 == '/';
            }
            bVar3 = in_stack_ffffffffffffff86 ^ 0xff;
          }
          if ((bVar3 & 1) == 0) {
            while( true ) {
              bVar1 = __gnu_cxx::operator!=
                                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)CONCAT17(bVar3,CONCAT16(in_stack_ffffffffffffff86,
                                                            CONCAT15(in_stack_ffffffffffffff85,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffff84,
                                                  in_stack_ffffffffffffff80)))),
                                 in_stack_ffffffffffffff78);
              in_stack_ffffffffffffff85 = false;
              if (bVar1) {
                pcVar2 = __gnu_cxx::
                         __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ::operator*(&local_8);
                in_stack_ffffffffffffff85 = *pcVar2 == '/';
              }
              if ((bool)in_stack_ffffffffffffff85 == false) break;
              __gnu_cxx::
              __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator++(&local_8);
            }
          }
          else {
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&local_8);
            __last._M_current._7_1_ = uVar4;
            __last._M_current._0_7_ = in_stack_ffffffffffffff90;
            local_8 = std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                                (in_stack_ffffffffffffff98,__last,(char *)in_RDI);
          }
        }
      }
      else if ((((local_19 & 1) == 0) ||
               (bVar1 = __gnu_cxx::operator!=
                                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)CONCAT17(in_stack_ffffffffffffff87,
                                               CONCAT16(in_stack_ffffffffffffff86,
                                                        CONCAT15(in_stack_ffffffffffffff85,
                                                                 CONCAT14(in_stack_ffffffffffffff84,
                                                                          in_stack_ffffffffffffff80)
                                                                ))),in_stack_ffffffffffffff78),
               !bVar1)) ||
              (pcVar2 = __gnu_cxx::
                        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        ::operator*(&local_8), *pcVar2 != ':')) {
        __last_00._M_current._7_1_ = uVar4;
        __last_00._M_current._0_7_ = in_stack_ffffffffffffff90;
        local_8 = std::find<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char>
                            (in_RDI[1]._M_current,__last_00,(char *)in_RDI);
      }
      else {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_8);
      }
    }
    else {
      local_8._M_current = in_RDI[2]._M_current;
    }
  }
  return (const_iterator)local_8._M_current;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::increment(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    bool fromStart = i == _first || i == _prefix;
    if (i != _last) {
        if (fromStart && i == _first && _prefix > _first) {
            i = _prefix;
        }
        else if (*i++ == preferred_separator) {
            // we can only sit on a slash if it is a network name or a root
            if (i != _last && *i == preferred_separator) {
                if (fromStart && !(i + 1 != _last && *(i + 1) == preferred_separator)) {
                    // leadind double slashes detected, treat this and the
                    // following until a slash as one unit
                    i = std::find(++i, _last, preferred_separator);
                }
                else {
                    // skip redundant slashes
                    while (i != _last && *i == preferred_separator) {
                        ++i;
                    }
                }
            }
        }
        else {
            if (fromStart && i != _last && *i == ':') {
                ++i;
            }
            else {
                i = std::find(i, _last, preferred_separator);
            }
        }
    }
    return i;
}